

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O2

void __thiscall
KMaxDistance::edgeCosts
          (KMaxDistance *this,double *image,int width,int height,double brSigma,double sxy,
          double *xCosts,double *yCosts)

{
  double *pdVar1;
  ulong uVar2;
  int iVar3;
  int x_1;
  int x;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  auVar5._8_8_ = 0x7fffffffffffffff;
  auVar5._0_8_ = 0x7fffffffffffffff;
  pdVar1 = image + 1;
  for (uVar2 = 0; uVar2 != (uint)(~(height >> 0x1f) & height); uVar2 = uVar2 + 1) {
    for (uVar4 = 0; (~((int)(width - 1U) >> 0x1f) & width - 1U) != uVar4; uVar4 = uVar4 + 1) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = pdVar1[uVar4 - 1] - pdVar1[uVar4];
      auVar7 = vandpd_avx(auVar6,auVar5);
      xCosts[uVar4] = auVar7._0_8_ + sxy;
    }
    pdVar1 = pdVar1 + width;
    xCosts = xCosts + width;
  }
  iVar3 = 1;
  if (1 < height) {
    iVar3 = height;
  }
  pdVar1 = image + width;
  for (uVar2 = 0; uVar2 != iVar3 - 1; uVar2 = uVar2 + 1) {
    for (uVar4 = 0; (uint)(~(width >> 0x1f) & width) != uVar4; uVar4 = uVar4 + 1) {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = image[uVar4] - pdVar1[uVar4];
      auVar7 = vandpd_avx(auVar7,auVar5);
      yCosts[uVar4] = auVar7._0_8_ + sxy;
    }
    pdVar1 = pdVar1 + width;
    image = image + width;
    yCosts = yCosts + width;
  }
  return;
}

Assistant:

void KMaxDistance::edgeCosts( const double *image, const int width, const int height,
    const double brSigma, const double sxy, double *xCosts, double *yCosts ){
    
    //double sxy2 = sxy*sxy;
    for ( int y = 0; y < height; ++y ){
        for ( int x = 0; x < width-1; ++x ){
            int idx = y*width + x;
            //double dbr = gaussInv( image[idx] - image[idx+1], brSigma );
            //xCosts[idx] = sqrt( sxy2 + dbr*dbr );
            xCosts[idx] = fabs(image[idx] - image[idx+1]) + sxy;
        }
    }
    for ( int y = 0; y < height-1; ++y ){
        for ( int x = 0; x < width; ++x ){
            int idx = y*width + x;
            //double dbr = gaussInv( image[idx] - image[idx+width], brSigma );
            //yCosts[idx] = sqrt( sxy2 + dbr*dbr );
            yCosts[idx] = fabs(image[idx] - image[idx+width]) + sxy;
        }
    }
}